

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::IsLinkable(cmGeneratorTarget *this)

{
  bool bVar1;
  TargetType TVar2;
  
  TVar2 = cmTarget::GetType(this->Target);
  if (TVar2 != STATIC_LIBRARY) {
    TVar2 = cmTarget::GetType(this->Target);
    if (TVar2 != SHARED_LIBRARY) {
      TVar2 = cmTarget::GetType(this->Target);
      if (TVar2 != MODULE_LIBRARY) {
        TVar2 = cmTarget::GetType(this->Target);
        if (TVar2 != UNKNOWN_LIBRARY) {
          TVar2 = cmTarget::GetType(this->Target);
          if (TVar2 != OBJECT_LIBRARY) {
            TVar2 = cmTarget::GetType(this->Target);
            if (TVar2 != INTERFACE_LIBRARY) {
              bVar1 = cmTarget::IsExecutableWithExports(this->Target);
              return bVar1;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool cmGeneratorTarget::IsLinkable() const
{
  return (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
          this->GetType() == cmStateEnums::SHARED_LIBRARY ||
          this->GetType() == cmStateEnums::MODULE_LIBRARY ||
          this->GetType() == cmStateEnums::UNKNOWN_LIBRARY ||
          this->GetType() == cmStateEnums::OBJECT_LIBRARY ||
          this->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
          this->IsExecutableWithExports());
}